

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceReverseCountFind_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType baseDataType)

{
  undefined4 dataType;
  bool bVar1;
  RenderContext *pRVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  char *local_248;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  deUint32 local_1b8;
  ContextType local_1a4;
  undefined1 local_1a0 [8];
  ostringstream source;
  DataType baseDataType_local;
  ShaderFunction function_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  source._372_4_ = function;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_1a4.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_1b8 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_1a4,(ApiType)local_1b8);
  if (bVar1) {
    local_248 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_248 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar3 = std::operator<<((ostream *)local_1a0,local_248);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1d8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  dataType = source._372_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"value",&local_219);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_1f8,dataType,&local_218);
  std::operator<<(poVar3,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1d8);
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    std::operator<<((ostream *)local_1a0,"    bitfieldReverse(value);\n");
    break;
  case SHADERTYPE_FRAGMENT:
    std::operator<<((ostream *)local_1a0,"    bitCount(value);\n");
    break;
  case SHADERTYPE_GEOMETRY:
    std::operator<<((ostream *)local_1a0,"    findMSB(value);\n");
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    std::operator<<((ostream *)local_1a0,"    findLSB(value);\n");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceReverseCountFind (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType baseDataType)
{
	DE_ASSERT(function == SHADER_FUNCTION_BITFIELD_REVERSE ||
		function == SHADER_FUNCTION_BIT_COUNT ||
		function == SHADER_FUNCTION_FIND_MSB ||
		function == SHADER_FUNCTION_FIND_LSB);

	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(baseDataType, "value");

	switch (function)
	{
		case SHADER_FUNCTION_BITFIELD_REVERSE:	source << "    bitfieldReverse(value);\n";	break;
		case SHADER_FUNCTION_BIT_COUNT:			source << "    bitCount(value);\n";			break;
		case SHADER_FUNCTION_FIND_MSB:			source << "    findMSB(value);\n";			break;
		case SHADER_FUNCTION_FIND_LSB:			source << "    findLSB(value);\n";			break;
		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}